

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<tcb::rational<long>const&>::
captureExpression<(Catch::Internal::Operator)2,tcb::rational<long>>
          (ExpressionLhs<tcb::rational<long>const&> *this,rational<long> *rhs)

{
  ResultBuilder *pRVar1;
  rational<long> *_value;
  rational<long> *_value_00;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,
                      rhs->denom_ * **(long **)(this + 8) < (*(long **)(this + 8))[1] * rhs->num_);
  Detail::StringMakerBase<true>::convert<tcb::rational<long>>
            (&local_38,*(StringMakerBase<true> **)(this + 8),_value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::StringMakerBase<true>::convert<tcb::rational<long>>
            (&local_58,(StringMakerBase<true> *)rhs,_value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"<","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }